

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_set.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalSet::GetData
          (PhysicalSet *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  char *pcVar1;
  bool bVar2;
  ConfigurationOption *pCVar3;
  CatalogException *this_00;
  undefined8 uVar4;
  string *msg;
  undefined8 *in_RSI;
  long in_RDI;
  DBConfig *config_1;
  DatabaseInstance *db;
  Value input_val;
  SetScope variable_scope;
  iterator entry;
  optional_ptr<const_duckdb::ConfigurationOption,_true> option;
  DBConfig *config;
  string *in_stack_00000718;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>_>
  *in_stack_fffffffffffffd98;
  Value *in_stack_fffffffffffffda0;
  allocator *this_01;
  undefined8 in_stack_fffffffffffffdc0;
  undefined1 strict;
  LogicalType *in_stack_fffffffffffffdc8;
  ClientContext *in_stack_fffffffffffffdd0;
  Value *in_stack_fffffffffffffdd8;
  string *in_stack_fffffffffffffde8;
  ClientContext *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  char cVar5;
  allocator local_1b9;
  string local_1b8 [24];
  Value *in_stack_fffffffffffffe60;
  SetScope in_stack_fffffffffffffe6f;
  string *in_stack_fffffffffffffe70;
  ExtensionOption *in_stack_fffffffffffffe78;
  ClientContext *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffe88;
  ConfigurationOption *in_stack_fffffffffffffe90;
  DatabaseInstance *in_stack_fffffffffffffe98;
  DBConfig *in_stack_fffffffffffffea0;
  string local_130 [39];
  allocator local_109;
  string local_108 [48];
  string *in_stack_ffffffffffffff28;
  DBConfig *in_stack_ffffffffffffff30;
  Value local_98;
  char local_51;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
  local_40;
  ConfigurationOption *local_38;
  DBConfig *local_30;
  undefined8 *local_18;
  SourceResultType local_1;
  
  strict = (undefined1)((ulong)in_stack_fffffffffffffdc0 >> 0x38);
  local_18 = in_RSI;
  local_30 = DBConfig::GetConfig((ClientContext *)0x17e6157);
  DBConfig::CheckLock(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_38 = (ConfigurationOption *)DBConfig::GetOptionByName((string *)in_stack_fffffffffffffdd8);
  bVar2 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_38);
  if (bVar2) {
    local_51 = *(char *)(in_RDI + 0xe0);
    if (local_51 == '\0') {
      pCVar3 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)
                          in_stack_fffffffffffffda0);
      if (pCVar3->set_local == (set_local_function_t)0x0) {
        local_51 = '\x03';
      }
      else {
        local_51 = '\x02';
      }
    }
    this_00 = (CatalogException *)(in_RDI + 0xa0);
    pCVar3 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                       ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)
                        in_stack_fffffffffffffda0);
    pcVar1 = pCVar3->parameter_type;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff30,pcVar1,(allocator *)&stack0xffffffffffffff2f);
    DBConfig::ParseLogicalType(in_stack_00000718);
    Value::CastAs(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                  (bool)strict);
    LogicalType::~LogicalType((LogicalType *)0x17e63c8);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
    if (local_51 == '\x02') {
      cVar5 = local_51;
      pCVar3 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)
                          in_stack_fffffffffffffda0);
      if (pCVar3->set_local == (set_local_function_t)0x0) {
        uVar4 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe98,"option \"%s\" cannot be set locally",
                   (allocator *)&stack0xfffffffffffffe97);
        ::std::__cxx11::string::string((string *)&stack0xfffffffffffffe70,(string *)(in_RDI + 0x80))
        ;
        CatalogException::CatalogException<std::__cxx11::string>
                  (this_00,(string *)CONCAT17(cVar5,in_stack_fffffffffffffe08),
                   in_stack_fffffffffffffe00);
        __cxa_throw(uVar4,&CatalogException::typeinfo,CatalogException::~CatalogException);
      }
      pCVar3 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)
                          in_stack_fffffffffffffda0);
      (*pCVar3->set_local)((ClientContext *)*local_18,&local_98);
    }
    else {
      if (local_51 != '\x03') {
        msg = (string *)__cxa_allocate_exception(0x10);
        this_01 = &local_1b9;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_1b8,"Unsupported SetScope for variable",this_01);
        InternalException::InternalException((InternalException *)this_01,msg);
        __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
      }
      cVar5 = local_51;
      pCVar3 = optional_ptr<const_duckdb::ConfigurationOption,_true>::operator->
                         ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)
                          in_stack_fffffffffffffda0);
      if (pCVar3->set_global == (set_global_function_t)0x0) {
        uVar4 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_108,"option \"%s\" cannot be set globally",&local_109);
        ::std::__cxx11::string::string(local_130,(string *)(in_RDI + 0x80));
        CatalogException::CatalogException<std::__cxx11::string>
                  (this_00,(string *)CONCAT17(cVar5,in_stack_fffffffffffffe08),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar3);
        __cxa_throw(uVar4,&CatalogException::typeinfo,CatalogException::~CatalogException);
      }
      DatabaseInstance::GetDatabase((ClientContext *)0x17e65df);
      DBConfig::GetConfig((ClientContext *)0x17e6603);
      optional_ptr<const_duckdb::ConfigurationOption,_true>::operator*
                ((optional_ptr<const_duckdb::ConfigurationOption,_true> *)in_stack_fffffffffffffda0)
      ;
      DBConfig::SetOption(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                          in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    local_1 = FINISHED;
    Value::~Value(in_stack_fffffffffffffda0);
  }
  else {
    local_40._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>_>
         ::find(in_stack_fffffffffffffd98,(key_type *)0x17e61cc);
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>_>
         ::end(in_stack_fffffffffffffd98);
    bVar2 = ::std::__detail::operator==(&local_40,&local_48);
    if (bVar2) {
      Catalog::AutoloadExtensionByConfigName(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      local_50._M_cur =
           (__node_type *)
           ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>_>
           ::find(in_stack_fffffffffffffd98,(key_type *)0x17e6247);
      local_40._M_cur = local_50._M_cur;
    }
    ::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_false,_true>
                  *)0x17e627f);
    SetExtensionVariable
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe6f,in_stack_fffffffffffffe60);
    local_1 = FINISHED;
  }
  return local_1;
}

Assistant:

SourceResultType PhysicalSet::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &config = DBConfig::GetConfig(context.client);
	// check if we are allowed to change the configuration option
	config.CheckLock(name);
	auto option = DBConfig::GetOptionByName(name);
	if (!option) {
		// check if this is an extra extension variable
		auto entry = config.extension_parameters.find(name);
		if (entry == config.extension_parameters.end()) {
			Catalog::AutoloadExtensionByConfigName(context.client, name);
			entry = config.extension_parameters.find(name);
			D_ASSERT(entry != config.extension_parameters.end());
		}
		SetExtensionVariable(context.client, entry->second, name, scope, value);
		return SourceResultType::FINISHED;
	}
	SetScope variable_scope = scope;
	if (variable_scope == SetScope::AUTOMATIC) {
		if (option->set_local) {
			variable_scope = SetScope::SESSION;
		} else {
			D_ASSERT(option->set_global);
			variable_scope = SetScope::GLOBAL;
		}
	}

	Value input_val = value.CastAs(context.client, DBConfig::ParseLogicalType(option->parameter_type));
	switch (variable_scope) {
	case SetScope::GLOBAL: {
		if (!option->set_global) {
			throw CatalogException("option \"%s\" cannot be set globally", name);
		}
		auto &db = DatabaseInstance::GetDatabase(context.client);
		auto &config = DBConfig::GetConfig(context.client);
		config.SetOption(&db, *option, input_val);
		break;
	}
	case SetScope::SESSION:
		if (!option->set_local) {
			throw CatalogException("option \"%s\" cannot be set locally", name);
		}
		option->set_local(context.client, input_val);
		break;
	default:
		throw InternalException("Unsupported SetScope for variable");
	}

	return SourceResultType::FINISHED;
}